

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_or_allocate_builtin_input_member_location
          (CompilerMSL *this,BuiltIn builtin,uint32_t type_id,uint32_t index,uint32_t *comp)

{
  CompilerMSL *this_00;
  key_type kVar1;
  bool bVar2;
  uint32_t argument;
  uint32_t uVar3;
  SPIRType *pSVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  uint32_t uVar7;
  int iVar8;
  key_type local_54;
  TypeID local_50;
  uint32_t local_4c;
  SPIRType *local_48;
  ulong local_40;
  CompilerMSL *local_38;
  
  argument = get_member_location(this,type_id,index,comp);
  if (argument == 0xffffffff) {
    if (comp != (uint32_t *)0x0) {
      *comp = 0xffffffff;
    }
    local_50.id = type_id;
    local_40 = (ulong)builtin;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
    local_4c = index;
    local_48 = Compiler::get<spirv_cross::SPIRType>
                         ((Compiler *)this,
                          (pSVar4->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].
                          id);
    uVar3 = CompilerGLSL::type_to_location_count(&this->super_CompilerGLSL,local_48);
    uVar7 = 0;
    local_38 = this;
    do {
      argument = uVar7;
      iVar8 = 1;
      uVar7 = argument;
      do {
        if (uVar3 + iVar8 == 1) goto LAB_0031ed54;
        local_54 = uVar7;
        sVar5 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&(this->location_inputs_in_use)._M_h,&local_54);
        iVar8 = iVar8 + -1;
        uVar7 = uVar7 + 1;
      } while (sVar5 == 0);
      uVar7 = argument + 1;
    } while ((uint)-iVar8 < uVar3);
LAB_0031ed54:
    this_00 = local_38;
    Compiler::set_member_decoration
              ((Compiler *)local_38,local_50,local_4c,DecorationLocation,argument);
    kVar1 = (key_type)local_40;
    if (((this_00->msl_options).raw_buffer_tese_input == false) &&
       (bVar2 = Compiler::is_tessellating_triangles((Compiler *)this_00), kVar1 - 0xb < 2 && bVar2))
    {
      local_54 = 0xc;
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this_00->builtin_to_automatic_input_location,&local_54);
      *pmVar6 = argument;
      local_54 = 0xb;
      kVar1 = local_54;
    }
    local_54 = kVar1;
    pmVar6 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this_00->builtin_to_automatic_input_location,&local_54);
    *pmVar6 = argument;
    mark_location_as_used_by_shader(this_00,argument,local_48,StorageClassInput,true);
  }
  return argument;
}

Assistant:

uint32_t CompilerMSL::get_or_allocate_builtin_input_member_location(spv::BuiltIn builtin,
                                                                    uint32_t type_id, uint32_t index,
                                                                    uint32_t *comp)
{
	uint32_t loc = get_member_location(type_id, index, comp);
	if (loc != k_unknown_location)
		return loc;

	if (comp)
		*comp = k_unknown_component;

	// Late allocation. Find a location which is unused by the application.
	// This can happen for built-in inputs in tessellation which are mixed and matched with user inputs.
	auto &mbr_type = get<SPIRType>(get<SPIRType>(type_id).member_types[index]);
	uint32_t count = type_to_location_count(mbr_type);

	loc = 0;

	const auto location_range_in_use = [this](uint32_t location, uint32_t location_count) -> bool {
		for (uint32_t i = 0; i < location_count; i++)
			if (location_inputs_in_use.count(location + i) != 0)
				return true;
		return false;
	};

	while (location_range_in_use(loc, count))
		loc++;

	set_member_decoration(type_id, index, DecorationLocation, loc);

	// Triangle tess level inputs are shared in one packed float4,
	// mark both builtins as sharing one location.
	if (!msl_options.raw_buffer_tese_input && is_tessellating_triangles() &&
	    (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter))
	{
		builtin_to_automatic_input_location[BuiltInTessLevelInner] = loc;
		builtin_to_automatic_input_location[BuiltInTessLevelOuter] = loc;
	}
	else
		builtin_to_automatic_input_location[builtin] = loc;

	mark_location_as_used_by_shader(loc, mbr_type, StorageClassInput, true);
	return loc;
}